

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::TimingPathSymbol::checkDuplicatePaths
          (TimingPathSymbol *this,TimingPathMap *timingPathMap)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  char cVar4;
  undefined4 uVar5;
  size_t sVar6;
  Expression *this_00;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  _Storage<slang::ConstantRange,_true> this_01;
  Expression *this_02;
  long lVar10;
  Expression *this_03;
  Expression *pEVar11;
  size_type sVar12;
  uint uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
  *ptVar17;
  bool bVar18;
  _Storage<slang::ConstantRange,_true> _Var19;
  ulong uVar20;
  _Storage<slang::ConstantRange,_true> *p_Var21;
  _Storage<slang::ConstantRange,_true> _Var22;
  _Storage<slang::ConstantRange,_true> _Var23;
  Diagnostic *pDVar24;
  undefined8 *puVar25;
  value_type *elements;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
  *ptVar26;
  uint uVar27;
  value_type_pointer ppVar28;
  EvalContext *pEVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  pointer ppEVar34;
  pointer ppEVar35;
  long lVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  optional<slang::ConstantRange> oVar43;
  bool outputRangeIdentical;
  bool inputRangeIdentical;
  locator res;
  Symbol *input;
  Symbol *output;
  bool local_462;
  bool local_461;
  value_type_pointer local_458;
  _Storage<slang::ConstantRange,_true> local_440;
  byte local_438;
  value_type_pointer local_430;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
  *local_428;
  pointer local_420;
  _Storage<slang::ConstantRange,_true> local_418;
  byte local_410;
  value_type_pointer local_408;
  Expression *local_400;
  TimingPathSymbol *local_3f8;
  _Storage<slang::ConstantRange,_true> local_3f0;
  _Storage<slang::ConstantRange,_true> local_3e8;
  uint local_3dc;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
  *local_3d8;
  value_type_pointer local_3d0;
  pointer local_3c8;
  pointer local_3c0;
  _Storage<slang::ConstantRange,_true> *local_3b8;
  _Storage<slang::ConstantRange,_true> *local_3b0;
  pointer local_3a8;
  value_type_pointer local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  Scope *local_388;
  undefined1 local_380 [40];
  undefined1 local_358 [16];
  bitmask<slang::ast::EvalFlags> local_348;
  undefined1 local_344 [16];
  undefined4 local_334;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_330;
  LValue **local_278;
  size_type local_270;
  size_type local_268;
  LValue *local_260 [5];
  SmallVectorBase<slang::Diagnostic> local_238;
  SmallVectorBase<slang::Diagnostic> local_140;
  SourceRange local_48;
  bool local_38;
  
  local_388 = (this->super_Symbol).parentScope;
  local_380._24_16_ = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_380._8_4_ = 0xffffffff;
  local_380._16_8_ = 0;
  local_348.m_bits = '\x02';
  local_330.data_ = (pointer)local_330.firstElement;
  local_344 = (undefined1  [16])0x0;
  local_334 = 0;
  local_330.len = 0;
  local_330.cap = 2;
  local_278 = local_260;
  local_270 = 0;
  local_268 = 5;
  local_238.data_ = (pointer)local_238.firstElement;
  local_238.len = 0;
  local_238.cap = 2;
  local_140.data_ = (pointer)local_140.firstElement;
  local_140.len = 0;
  local_140.cap = 2;
  local_48.startLoc = (SourceLocation)0x0;
  local_48.endLoc = (SourceLocation)0x0;
  local_38 = false;
  _Var19 = (_Storage<slang::ConstantRange,_true>)timingPathMap;
  local_380._0_8_ = local_388;
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar6 = (this->outputs)._M_extent._M_extent_value;
  if (sVar6 != 0) {
    ppEVar34 = (this->outputs)._M_ptr;
    local_3c8 = ppEVar34 + sVar6;
    local_428 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                 *)timingPathMap;
    do {
      local_400 = *ppEVar34;
      _Var19 = (_Storage<slang::ConstantRange,_true>)Expression::getSymbolReference(local_400,true);
      ptVar26 = local_428;
      local_3e8 = _Var19;
      if (_Var19 != (_Storage<slang::ConstantRange,_true>)0x0) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = _Var19;
        uVar30 = SUB168(auVar15 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar15 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar20 = uVar30 >> ((byte)*(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
                                    *)timingPathMap & 0x3f);
        uVar5 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar30 & 0xff];
        uVar33 = 0;
        uVar32 = uVar20;
        do {
          pgVar2 = *(group_type_pointer *)((long)timingPathMap + 0x10) + uVar32;
          uVar37 = (uchar)uVar5;
          auVar41[0] = -(pgVar2->m[0].n == uVar37);
          uVar38 = (uchar)((uint)uVar5 >> 8);
          auVar41[1] = -(pgVar2->m[1].n == uVar38);
          uVar39 = (uchar)((uint)uVar5 >> 0x10);
          auVar41[2] = -(pgVar2->m[2].n == uVar39);
          uVar40 = (uchar)((uint)uVar5 >> 0x18);
          auVar41[3] = -(pgVar2->m[3].n == uVar40);
          auVar41[4] = -(pgVar2->m[4].n == uVar37);
          auVar41[5] = -(pgVar2->m[5].n == uVar38);
          auVar41[6] = -(pgVar2->m[6].n == uVar39);
          auVar41[7] = -(pgVar2->m[7].n == uVar40);
          auVar41[8] = -(pgVar2->m[8].n == uVar37);
          auVar41[9] = -(pgVar2->m[9].n == uVar38);
          auVar41[10] = -(pgVar2->m[10].n == uVar39);
          auVar41[0xb] = -(pgVar2->m[0xb].n == uVar40);
          auVar41[0xc] = -(pgVar2->m[0xc].n == uVar37);
          auVar41[0xd] = -(pgVar2->m[0xd].n == uVar38);
          auVar41[0xe] = -(pgVar2->m[0xe].n == uVar39);
          auVar41[0xf] = -(pgVar2->m[0xf].n == uVar40);
          for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe); uVar27 != 0;
              uVar27 = uVar27 - 1 & uVar27) {
            uVar13 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            if (_Var19 == *(_Storage<slang::ConstantRange,_true> *)
                           (*(value_type_pointer *)((long)timingPathMap + 0x18) +
                           uVar32 * 0xf + (ulong)uVar13)) {
              local_458 = *(value_type_pointer *)((long)timingPathMap + 0x18) +
                          uVar32 * 0xf + (ulong)uVar13;
              goto LAB_0028b64b;
            }
          }
          if (((*(group_type_pointer *)((long)timingPathMap + 0x10))[uVar32].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar30 & 7]) == 0) break;
          lVar31 = uVar32 + uVar33;
          uVar33 = uVar33 + 1;
          uVar32 = lVar31 + 1U & *(ulong *)((long)timingPathMap + 8);
        } while (uVar33 <= *(ulong *)((long)timingPathMap + 8));
        local_458 = (value_type_pointer)0x0;
LAB_0028b64b:
        local_420 = ppEVar34;
        local_3d0 = local_458;
        if (local_458 == (value_type_pointer)0x0) {
          if (*(ulong *)(local_428 + 0x28) < *(ulong *)(local_428 + 0x20)) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                      ((locator *)&local_418._M_value,local_428,(arrays_type *)local_428,uVar20,
                       uVar30,(try_emplace_args_t *)&local_440._M_value,(Symbol **)&local_3e8);
            *(long *)(ptVar26 + 0x28) = *(long *)(ptVar26 + 0x28) + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,boost::unordered::unordered_flat_map<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                      ((locator *)&local_418._M_value,local_428,uVar30,
                       (try_emplace_args_t *)&local_440._M_value,(Symbol **)&local_3e8);
          }
          local_458 = local_408;
        }
        _Var19 = (_Storage<slang::ConstantRange,_true>)local_380;
        oVar43 = Expression::evalSelector(local_400,(EvalContext *)_Var19,false);
        local_440 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload;
        local_438 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        if (this->isResolved == false) {
          resolve(this);
        }
        sVar6 = (this->inputs)._M_extent._M_extent_value;
        timingPathMap = (TimingPathMap *)ptVar26;
        if (sVar6 != 0) {
          local_3d8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                       *)&local_458->second;
          ppEVar35 = (this->inputs)._M_ptr;
          local_3c0 = ppEVar35 + sVar6;
          do {
            this_00 = *ppEVar35;
            _Var19 = (_Storage<slang::ConstantRange,_true>)
                     Expression::getSymbolReference(this_00,true);
            ptVar17 = local_428;
            local_3f0 = _Var19;
            if (_Var19 != (_Storage<slang::ConstantRange,_true>)0x0) {
              auVar16._8_8_ = 0;
              auVar16._0_8_ = _Var19;
              uVar30 = SUB168(auVar16 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar16 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar20 = uVar30 >> ((byte)(local_458->second).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                                        .arrays.groups_size_index & 0x3f);
              pgVar7 = (local_458->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                       .arrays.groups_;
              uVar5 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar30 & 0xff];
              uVar33 = 0;
              uVar32 = uVar20;
              do {
                pgVar3 = pgVar7 + uVar32;
                uVar37 = (uchar)uVar5;
                auVar42[0] = -(pgVar3->m[0].n == uVar37);
                uVar38 = (uchar)((uint)uVar5 >> 8);
                auVar42[1] = -(pgVar3->m[1].n == uVar38);
                uVar39 = (uchar)((uint)uVar5 >> 0x10);
                auVar42[2] = -(pgVar3->m[2].n == uVar39);
                uVar40 = (uchar)((uint)uVar5 >> 0x18);
                auVar42[3] = -(pgVar3->m[3].n == uVar40);
                auVar42[4] = -(pgVar3->m[4].n == uVar37);
                auVar42[5] = -(pgVar3->m[5].n == uVar38);
                auVar42[6] = -(pgVar3->m[6].n == uVar39);
                auVar42[7] = -(pgVar3->m[7].n == uVar40);
                auVar42[8] = -(pgVar3->m[8].n == uVar37);
                auVar42[9] = -(pgVar3->m[9].n == uVar38);
                auVar42[10] = -(pgVar3->m[10].n == uVar39);
                auVar42[0xb] = -(pgVar3->m[0xb].n == uVar40);
                auVar42[0xc] = -(pgVar3->m[0xc].n == uVar37);
                auVar42[0xd] = -(pgVar3->m[0xd].n == uVar38);
                auVar42[0xe] = -(pgVar3->m[0xe].n == uVar39);
                auVar42[0xf] = -(pgVar3->m[0xf].n == uVar40);
                uVar27 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
                if (uVar27 != 0) {
                  ppVar8 = (local_458->second).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                           .arrays.elements_;
                  do {
                    iVar14 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                      }
                    }
                    if (_Var19 == *(_Storage<slang::ConstantRange,_true> *)
                                   ((long)&ppVar8[uVar32 * 0xf].first + (ulong)(uint)(iVar14 << 5)))
                    {
                      ppVar28 = (value_type_pointer)
                                ((long)&ppVar8[uVar32 * 0xf].first + (ulong)(uint)(iVar14 << 5));
                      goto LAB_0028b82f;
                    }
                    uVar27 = uVar27 - 1 & uVar27;
                  } while (uVar27 != 0);
                }
                if ((pgVar7[uVar32].m[0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar30 & 7]) == 0) {
                  ppVar28 = (value_type_pointer)0x0;
                  goto LAB_0028b82f;
                }
                uVar9 = (local_458->second).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                        .arrays.groups_size_mask;
                lVar31 = uVar32 + uVar33;
                uVar33 = uVar33 + 1;
                uVar32 = lVar31 + 1U & uVar9;
              } while (uVar33 <= uVar9);
              ppVar28 = (value_type_pointer)0x0;
LAB_0028b82f:
              local_430 = ppVar28;
              if (ppVar28 == (value_type_pointer)0x0) {
                if ((local_458->second).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                    .size_ctrl.size <
                    (local_458->second).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                            ((locator *)&local_418._M_value,local_3d8,(arrays_type *)local_3d8,
                             uVar20,uVar30,(try_emplace_args_t *)&local_3f8,(Symbol **)&local_3f0);
                  psVar1 = &(local_458->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                            .size_ctrl.size;
                  *psVar1 = *psVar1 + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
                            ((locator *)&local_418._M_value,local_3d8,uVar30,
                             (try_emplace_args_t *)&local_3f8,(Symbol **)&local_3f0);
                }
                local_430 = local_408;
              }
              _Var19 = (_Storage<slang::ConstantRange,_true>)local_380;
              oVar43 = Expression::evalSelector(this_00,(EvalContext *)_Var19,false);
              local_418 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload;
              local_410 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_engaged;
              p_Var21 = (_Storage<slang::ConstantRange,_true> *)
                        (local_430->second).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                        .arrays.groups_size_index;
              local_3b8 = (_Storage<slang::ConstantRange,_true> *)
                          (local_430->second).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
                          .arrays.groups_size_mask;
              if (p_Var21 == local_3b8) {
                uVar27 = 0;
                ptVar26 = ptVar17;
              }
              else {
                uVar27 = 0;
                local_3a8 = ppEVar35;
                local_3a0 = ppVar28;
                do {
                  this_01 = *p_Var21;
                  local_3b0 = p_Var21;
                  if (*(char *)((long)this_01 + 0x51) == '\0') {
                    resolve((TimingPathSymbol *)this_01);
                  }
                  if (*(long *)((long)this_01 + 0x80) != 0) {
                    puVar25 = *(undefined8 **)((long)this_01 + 0x78);
                    local_398 = puVar25 + *(long *)((long)this_01 + 0x80);
                    local_3dc = uVar27;
                    do {
                      _Var23 = local_3e8;
                      this_02 = (Expression *)*puVar25;
                      _Var19 = (_Storage<slang::ConstantRange,_true>)0x1;
                      local_390 = puVar25;
                      _Var22 = (_Storage<slang::ConstantRange,_true>)
                               Expression::getSymbolReference(this_02,true);
                      if (_Var22 == _Var23) {
                        pEVar29 = (EvalContext *)local_380;
                        oVar43 = Expression::evalSelector(this_02,pEVar29,false);
                        _Var23 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_payload;
                        _Var19._1_7_ = (undefined7)((ulong)pEVar29 >> 8);
                        _Var19._M_value.left._0_1_ = local_438;
                        local_462 = (bool)local_438 ==
                                    oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                                    _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                    _M_engaged;
                        if ((local_462 & local_438) == 1) {
                          local_462 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                                      _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                      _M_payload._4_4_ == local_440._M_value.right &&
                                      local_440._M_value.left ==
                                      oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                                      _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                      _M_payload._0_4_;
                        }
                        bVar18 = true;
                        if ((local_438 != 0) &&
                           (((undefined1  [12])
                             oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                             _M_payload.super__Optional_payload_base<slang::ConstantRange> &
                            (undefined1  [12])0x1) != (undefined1  [12])0x0)) {
                          bVar18 = ConstantRange::overlaps(&local_440._M_value,_Var23._M_value);
                          _Var19 = _Var23;
                        }
                      }
                      else {
                        bVar18 = false;
                      }
                      if (bVar18 != false) {
                        if (*(char *)((long)this_01 + 0x51) == '\0') {
                          resolve((TimingPathSymbol *)this_01);
                        }
                        lVar31 = *(long *)((long)this_01 + 0x70);
                        if (lVar31 != 0) {
                          lVar10 = *(long *)((long)this_01 + 0x68);
                          lVar36 = 0;
                          do {
                            _Var23 = local_3f0;
                            this_03 = *(Expression **)(lVar10 + lVar36);
                            _Var19 = (_Storage<slang::ConstantRange,_true>)0x1;
                            _Var22 = (_Storage<slang::ConstantRange,_true>)
                                     Expression::getSymbolReference(this_03,true);
                            if (_Var22 == _Var23) {
                              pEVar29 = (EvalContext *)local_380;
                              oVar43 = Expression::evalSelector(this_03,pEVar29,false);
                              _Var23 = oVar43.super__Optional_base<slang::ConstantRange,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<slang::ConstantRange>._M_payload
                              ;
                              _Var19._1_7_ = (undefined7)((ulong)pEVar29 >> 8);
                              _Var19._M_value.left._0_1_ = local_410;
                              local_461 = (bool)local_410 ==
                                          oVar43.
                                          super__Optional_base<slang::ConstantRange,_true,_true>.
                                          _M_payload.
                                          super__Optional_payload_base<slang::ConstantRange>.
                                          _M_engaged;
                              if ((local_461 & local_410) == 1) {
                                local_461 = oVar43.
                                            super__Optional_base<slang::ConstantRange,_true,_true>.
                                            _M_payload.
                                            super__Optional_payload_base<slang::ConstantRange>.
                                            _M_payload._4_4_ == local_418._M_value.right &&
                                            local_418._M_value.left ==
                                            oVar43.
                                            super__Optional_base<slang::ConstantRange,_true,_true>.
                                            _M_payload.
                                            super__Optional_payload_base<slang::ConstantRange>.
                                            _M_payload._0_4_;
                              }
                              bVar18 = true;
                              if ((local_410 != 0) &&
                                 (((undefined1  [12])
                                   oVar43.super__Optional_base<slang::ConstantRange,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange> &
                                  (undefined1  [12])0x1) != (undefined1  [12])0x0)) {
                                bVar18 = ConstantRange::overlaps
                                                   (&local_418._M_value,_Var23._M_value);
                                _Var19 = _Var23;
                              }
                            }
                            else {
                              bVar18 = false;
                            }
                            if ((this_00 != this_03 || local_400 != this_02) && (bVar18 != false)) {
                              if (((local_462 & 1U) == 0) || ((local_461 & 1U) == 0))
                              goto LAB_0028bb3a;
                              if (this->edgeIdentifier == *(EdgeKind *)((long)this_01 + 0x4c)) {
                                if (this->isResolved == false) {
                                  resolve(this);
                                }
                                pEVar11 = this->conditionExpr;
                                if (*(char *)((long)this_01 + 0x51) == '\0') {
                                  resolve((TimingPathSymbol *)this_01);
                                }
                                sVar12 = *(size_type *)((long)this_01 + 0x60);
                                cVar4 = *(char *)&(((
                                                  SmallVector<slang::ast::EvalContext::Frame,_2UL> *
                                                  )((long)this_01 + 0x50))->
                                                  super_SmallVectorBase<slang::ast::EvalContext::Frame>
                                                  ).data_;
                                _Var19 = this_01;
                                if (this->isStateDependent == (bool)cVar4) {
                                  if (((this->isStateDependent == false) || (cVar4 == '\0')) ||
                                     (((sVar12 != 0) == (pEVar11 != (Expression *)0x0) &&
                                      ((((pEVar11 == (Expression *)0x0 || (sVar12 == 0)) ||
                                        (&pEVar11->syntax->super_SyntaxNode == (SyntaxNode *)0x0))
                                       || ((_Var19 = *(_Storage<slang::ConstantRange,_true> *)
                                                      (sVar12 + 0x18),
                                           _Var19 == (_Storage<slang::ConstantRange,_true>)0x0 ||
                                           (bVar18 = slang::syntax::SyntaxNode::isEquivalentTo
                                                               (&pEVar11->syntax->super_SyntaxNode,
                                                                (SyntaxNode *)_Var19), bVar18)))))))
                                     ) {
LAB_0028bb3a:
                                    pDVar24 = Scope::addDiag(local_388,(DiagCode)0xec0006,
                                                             this_00->sourceRange);
                                    pDVar24 = Diagnostic::operator<<(pDVar24,local_400->sourceRange)
                                    ;
                                    pDVar24 = Diagnostic::addNote(pDVar24,(DiagCode)0xa0001,
                                                                  this_03->sourceRange);
                                    _Var19 = *(_Storage<slang::ConstantRange,_true> *)
                                              &(this_02->sourceRange).startLoc;
                                    Diagnostic::operator<<(pDVar24,this_02->sourceRange);
                                  }
                                }
                                else if (pEVar11 == (Expression *)0x0 && sVar12 == 0)
                                goto LAB_0028bb3a;
                              }
                            }
                            lVar36 = lVar36 + 8;
                          } while (lVar31 << 3 != lVar36);
                        }
                      }
                      puVar25 = local_390 + 1;
                      ppEVar34 = local_420;
                      ppEVar35 = local_3a8;
                      uVar27 = local_3dc;
                    } while (puVar25 != local_398);
                  }
                  uVar27 = uVar27 & 0xff;
                  if (this_01 == (_Storage<slang::ConstantRange,_true>)this) {
                    uVar27 = 1;
                  }
                  p_Var21 = local_3b0 + 1;
                  ptVar26 = local_428;
                } while (p_Var21 != local_3b8);
              }
              if ((uVar27 & 1) == 0) {
                _Var19 = (_Storage<slang::ConstantRange,_true>)&local_3f8;
                local_3f8 = this;
                std::
                vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>
                ::emplace_back<slang::ast::TimingPathSymbol_const*>
                          ((vector<slang::ast::TimingPathSymbol_const*,std::allocator<slang::ast::TimingPathSymbol_const*>>
                            *)&local_430->second,(TimingPathSymbol **)_Var19);
              }
            }
            ppEVar35 = ppEVar35 + 1;
            timingPathMap = (TimingPathMap *)ptVar26;
          } while (ppEVar35 != local_3c0);
        }
      }
      ppEVar34 = ppEVar34 + 1;
    } while (ppEVar34 != local_3c8);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_140,(EVP_PKEY_CTX *)_Var19);
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_238,(EVP_PKEY_CTX *)_Var19);
  if (local_278 != local_260) {
    operator_delete(local_278);
  }
  SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_330,(EVP_PKEY_CTX *)_Var19);
  return;
}

Assistant:

void TimingPathSymbol::checkDuplicatePaths(TimingPathMap& timingPathMap) const {
    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    EvalContext evalCtx(ASTContext(*parent, LookupLocation::max), EvalFlags::CacheResults);

    auto terminalOverlaps = [&](const Symbol& ourTerminal,
                                const std::optional<ConstantRange>& ourRange,
                                const Expression& otherExpr, bool& identicalRanges) {
        if (otherExpr.getSymbolReference() != &ourTerminal)
            return false;

        auto otherRange = otherExpr.evalSelector(evalCtx, /* enforceBounds */ false);
        identicalRanges = ourRange == otherRange;
        return !ourRange || !otherRange || ourRange->overlaps(*otherRange);
    };

    auto checkDup = [&](const TimingPathSymbol& otherPath, bool identicalRanges,
                        const Expression& inputExpr, const Expression& outputExpr,
                        const Expression& otherInputExpr, const Expression& otherOutputExpr) {
        // If these are literally the same path then it's not a dup, it's just ourselves.
        if (&inputExpr == &otherInputExpr && &outputExpr == &otherOutputExpr)
            return;

        // We've determined that our path and the `otherPath` have overlapping
        // source and dest terminals. If ranges are identical then we may not
        // have a dup, so check further.
        if (identicalRanges) {
            // If the paths have unique edges then they aren't dups.
            if (edgeIdentifier != otherPath.edgeIdentifier)
                return;

            // If one is conditional and the other is not, it's not a dup
            // unless the conditional one is also an ifnone condition.
            auto cond = getConditionExpr();
            auto otherCond = otherPath.getConditionExpr();
            if (isStateDependent != otherPath.isStateDependent) {
                if (cond || otherCond)
                    return;
            }
            else if (isStateDependent && otherPath.isStateDependent) {
                // If one is ifnone and the other is not, then not a dup.
                if ((!cond || !otherCond) && (cond || otherCond))
                    return;

                // If both are ifnone then there's a dup, otherwise check further.
                if (cond && otherCond) {
                    // If the condition makes this unique then it's not a dup.
                    // The LRM doesn't specify what it means for the condition expression
                    // to be unique; we check here at the syntactical level rather than
                    // the AST level.
                    auto lsyntax = cond->syntax;
                    auto rsyntax = otherCond->syntax;
                    if (lsyntax && rsyntax && !lsyntax->isEquivalentTo(*rsyntax))
                        return;
                }
            }
        }

        // Otherwise we've definitely found a dup, so issue a diagnostic.
        auto& diag = parent->addDiag(diag::DupTimingPath, inputExpr.sourceRange)
                     << outputExpr.sourceRange;
        diag.addNote(diag::NotePreviousDefinition, otherInputExpr.sourceRange)
            << otherOutputExpr.sourceRange;
    };

    for (auto outputExpr : getOutputs()) {
        if (auto output = outputExpr->getSymbolReference()) {
            // Find all paths that map to this output.
            auto& inputMap = timingPathMap[output];
            auto outputRange = outputExpr->evalSelector(evalCtx, /* enforceBounds */ false);

            for (auto inputExpr : getInputs()) {
                if (auto input = inputExpr->getSymbolReference()) {
                    // Find all paths that also map to this input.
                    auto& vec = inputMap[input];
                    auto inputRange = inputExpr->evalSelector(evalCtx, /* enforceBounds */ false);

                    // Look at each existing path and determine whether it's a duplicate.
                    bool alreadyAdded = false;
                    for (auto path : vec) {
                        for (auto otherOutputExpr : path->getOutputs()) {
                            // Only a dup if the output terminals overlap.
                            bool outputRangeIdentical;
                            if (terminalOverlaps(*output, outputRange, *otherOutputExpr,
                                                 outputRangeIdentical)) {
                                for (auto otherInputExpr : path->getInputs()) {
                                    // Only a dup if the input terminals overlap.
                                    bool inputRangeIdentical;
                                    if (terminalOverlaps(*input, inputRange, *otherInputExpr,
                                                         inputRangeIdentical)) {
                                        checkDup(*path, outputRangeIdentical && inputRangeIdentical,
                                                 *inputExpr, *outputExpr, *otherInputExpr,
                                                 *otherOutputExpr);
                                    }
                                }
                            }
                        }

                        // It's possible that *this* path can already be in the list,
                        // since you can have a declaration like this:
                        // (a[0], a[1] *> b) = 1
                        if (path == this)
                            alreadyAdded = true;
                    }

                    if (!alreadyAdded)
                        vec.push_back(this);
                }
            }
        }
    }
}